

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_mathutils.cc
# Opt level: O2

bool RigidBodyDynamics::Math::LinSolveGaussElimPivot(MatrixNd *A,VectorNd *b,VectorNd *x)

{
  double dVar1;
  uint uVar2;
  double *pdVar3;
  void *pvVar4;
  ulong uVar5;
  ostream *poVar6;
  double *pdVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  void *pvVar16;
  ulong uVar17;
  double dVar18;
  VectorNd px;
  
  px.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)
       (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            (x,(CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)&px);
  uVar13 = (A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  uVar15 = uVar13 & 0xffffffff;
  pvVar4 = operator_new__(uVar15 * 8);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&px,(DenseStorage<double,__1,__1,_1,_0> *)x);
  for (uVar5 = 0; uVar15 != uVar5; uVar5 = uVar5 + 1) {
    *(ulong *)((long)pvVar4 + uVar5 * 8) = uVar5;
  }
  uVar5 = 1;
  lVar9 = 0;
  uVar14 = 0;
  pvVar16 = pvVar4;
  while( true ) {
    uVar11 = uVar15;
    if (uVar15 < uVar14) {
      uVar11 = uVar14;
    }
    if (uVar14 == uVar15) break;
    pdVar7 = (A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
    lVar8 = (A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    dVar18 = ABS(pdVar7[uVar14 + *(long *)((long)pvVar4 + uVar14 * 8) * lVar8]);
    for (lVar12 = 0; uVar11 + lVar9 != lVar12; lVar12 = lVar12 + 1) {
      lVar10 = *(long *)((long)pvVar16 + lVar12 * 8);
      dVar1 = pdVar7[uVar14 + lVar10 * lVar8];
      if (dVar18 < ABS(dVar1)) {
        uVar2 = *(uint *)((long)pvVar4 + uVar14 * 8);
        *(long *)((long)pvVar4 + uVar14 * 8) = lVar10;
        *(ulong *)((long)pvVar16 + lVar12 * 8) = (ulong)uVar2;
        dVar18 = ABS(dVar1);
      }
    }
    for (uVar17 = uVar5; uVar17 < uVar15; uVar17 = uVar17 + 1) {
      lVar12 = *(long *)((long)pvVar4 + uVar14 * 8);
      lVar10 = lVar8 * lVar12;
      if (ABS(pdVar7[lVar10 + uVar14]) <= 2.220446049250313e-16) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Error: pivoting failed for matrix A = ");
        std::endl<char,std::char_traits<char>>(poVar6);
        poVar6 = std::operator<<((ostream *)&std::cerr,"A = ");
        poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
        poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)A)
        ;
        std::endl<char,std::char_traits<char>>(poVar6);
        poVar6 = std::operator<<((ostream *)&std::cerr,"b = ");
        poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)b);
        std::endl<char,std::char_traits<char>>(poVar6);
        pdVar7 = (A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                 m_data;
        lVar8 = (A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                m_rows;
        lVar10 = lVar12 * lVar8;
      }
      dVar18 = pdVar7[lVar10 + uVar17];
      dVar1 = pdVar7[lVar10 + uVar14];
      pdVar3 = (b->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      pdVar3[uVar17] = pdVar3[uVar17] - pdVar3[uVar14] * (dVar18 / dVar1);
      for (lVar12 = 0; uVar11 + lVar9 != lVar12; lVar12 = lVar12 + 1) {
        lVar10 = *(long *)((long)pvVar16 + lVar12 * 8) * lVar8;
        pdVar7[lVar10 + uVar17] =
             pdVar7[lVar10 + uVar17] - pdVar7[lVar10 + uVar14] * (dVar18 / dVar1);
      }
    }
    uVar5 = (ulong)((int)uVar5 + 1);
    lVar9 = lVar9 + -1;
    pvVar16 = (void *)((long)pvVar16 + 8);
    uVar14 = uVar14 + 1;
  }
  pdVar7 = (b->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  pdVar3 = (A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  lVar9 = (A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  do {
    uVar5 = (ulong)((int)uVar13 - 1);
    for (uVar13 = uVar13 & 0xffffffff; uVar13 < uVar15; uVar13 = uVar13 + 1) {
      px.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar5] =
           pdVar3[uVar5 + *(long *)((long)pvVar4 + uVar13 * 8) * lVar9] *
           px.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
           [uVar13] +
           px.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar5]
      ;
    }
    px.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar5] =
         (pdVar7[uVar5] -
         px.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar5])
         / pdVar3[*(long *)((long)pvVar4 + uVar5 * 8) * lVar9 + uVar5];
    uVar13 = uVar5;
  } while (uVar5 != 0);
  pdVar7 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  for (uVar13 = 0; uVar15 != uVar13; uVar13 = uVar13 + 1) {
    pdVar7[*(long *)((long)pvVar4 + uVar13 * 8)] =
         px.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar13];
  }
  operator_delete__(pvVar4);
  free(px.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return true;
}

Assistant:

RBDL_DLLAPI bool LinSolveGaussElimPivot (MatrixNd A, VectorNd b, VectorNd &x) {
  x = VectorNd::Zero(x.size());

  // We can only solve quadratic systems
  assert (A.rows() == A.cols());

  unsigned int n = A.rows();
  unsigned int pi;

  // the pivots
  size_t *pivot = new size_t[n];

  // temporary result vector which contains the pivoted result
  VectorNd px(x);

  unsigned int i,j,k;

  for (i = 0; i < n; i++)
    pivot[i] = i;

  for (j = 0; j < n; j++) {
    pi = j;
    Scalar pv = fabs (A(j,pivot[j]));

    // LOG << "j = " << j << " pv = " << pv << std::endl;
    // find the pivot
    for (k = j; k < n; k++) {
      Scalar pt = fabs (A(j,pivot[k]));
      if (pt > pv) {
        pv = pt;
        pi = k;
        unsigned int p_swap = pivot[j];
        pivot[j] = pivot[pi];
        pivot[pi] = p_swap;
        //	LOG << "swap " << j << " with " << pi << std::endl;
        //	LOG << "j = " << j << " pv = " << pv << std::endl;
      }
    }

    for (i = j + 1; i < n; i++) {
      if (Scalar(fabs(A(j,pivot[j]))) <= Scalar(std::numeric_limits<double>::epsilon())) {
        std::cerr << "Error: pivoting failed for matrix A = " << std::endl;
        std::cerr << "A = " << std::endl << A << std::endl;
        std::cerr << "b = " << b << std::endl;
      }
      //		assert (fabs(A(j,pivot[j])) > std::numeric_limits<double>::epsilon());
      Scalar d = A(i,pivot[j])/A(j,pivot[j]);

      b[i] -= b[j] * d;

      for (k = j; k < n; k++) {
        A(i,pivot[k]) -= A(j,pivot[k]) * d;
      }
    }
  }

  // warning: i is an unsigned int, therefore a for loop of the 
  // form "for (i = n - 1; i >= 0; i--)" might end up in getting an invalid
  // value for i!
  i = n;
  do {
    i--;

    for (j = i + 1; j < n; j++) {
      px[i] += A(i,pivot[j]) * px[j];
    }
    px[i] = (b[i] - px[i]) / A(i,pivot[i]);

  } while (i > 0);

  // Unswapping
  for (i = 0; i < n; i++) {
    x[pivot[i]] = px[i];
  }

  /*
     LOG << "A = " << std::endl << A << std::endl;
     LOG << "b = " << b << std::endl;
     LOG << "x = " << x << std::endl;
     LOG << "pivot = " << pivot[0] << " " << pivot[1] << " " << pivot[2] << std::endl;
     std::cout << LogOutput.str() << std::endl;
     */

  delete[] pivot;

  return true;
}